

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildUint8x16_1Int16
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot,RegSlot src7RegSlot,RegSlot src8RegSlot,
          RegSlot src9RegSlot,RegSlot src10RegSlot,RegSlot src11RegSlot,RegSlot src12RegSlot,
          RegSlot src13RegSlot,RegSlot src14RegSlot,RegSlot src15RegSlot,RegSlot src16RegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  RegSlot local_88;
  RegSlot local_84;
  RegSlot srcRegSlots [16];
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0x22b) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x16bc,"(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToU16)",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  srcRegSlots[0] = src3RegSlot;
  srcRegSlots[1] = src4RegSlot;
  srcRegSlots[2] = src5RegSlot;
  srcRegSlots[3] = src6RegSlot;
  srcRegSlots[4] = src7RegSlot;
  srcRegSlots[5] = src8RegSlot;
  srcRegSlots[6] = src9RegSlot;
  srcRegSlots[7] = src10RegSlot;
  srcRegSlots[8] = src11RegSlot;
  srcRegSlots[9] = src12RegSlot;
  srcRegSlots[10] = src13RegSlot;
  srcRegSlots[0xb] = src14RegSlot;
  srcRegSlots[0xc] = src15RegSlot;
  srcRegSlots[0xd] = src16RegSlot;
  local_88 = src1RegSlot;
  local_84 = src2RegSlot;
  BuildSimd_1Ints(this,newOpcode,offset,TySimd128U16,&local_88,dstRegSlot,0x10);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildUint8x16_1Int16(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG17)
{
    AssertMsg(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToU16, "Unexpected opcode for this format.");

    uint const LANES = 16;
    Js::RegSlot srcRegSlots[LANES];

    srcRegSlots[0] = src1RegSlot;
    srcRegSlots[1] = src2RegSlot;
    srcRegSlots[2] = src3RegSlot;
    srcRegSlots[3] = src4RegSlot;
    srcRegSlots[4] = src5RegSlot;
    srcRegSlots[5] = src6RegSlot;
    srcRegSlots[6] = src7RegSlot;
    srcRegSlots[7] = src8RegSlot;
    srcRegSlots[8] = src9RegSlot;
    srcRegSlots[9] = src10RegSlot;
    srcRegSlots[10] = src11RegSlot;
    srcRegSlots[11] = src12RegSlot;
    srcRegSlots[12] = src13RegSlot;
    srcRegSlots[13] = src14RegSlot;
    srcRegSlots[14] = src15RegSlot;
    srcRegSlots[15] = src16RegSlot;

    BuildSimd_1Ints(newOpcode, offset, TySimd128U16, srcRegSlots, dstRegSlot, LANES);
}